

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_upto_post_snapshot_test(void)

{
  fdb_seqnum_t seqnum;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  long extraout_RDX;
  char *pcVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  char *__format;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar13;
  fdb_iterator *pfVar14;
  long lVar15;
  btree *unaff_R13;
  ulong uVar16;
  fdb_kvs_handle *doc;
  undefined4 uVar17;
  undefined4 uVar18;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_file_handle *pfStackY_fc8;
  timeval tStackY_fc0;
  fdb_config fStackY_fb0;
  code *pcStackY_eb8;
  fdb_snapshot_info_t *pfStackY_eb0;
  ulong uStackY_ea8;
  fdb_kvs_handle *pfStackY_ea0;
  fdb_kvs_handle *pfStackY_e98;
  fdb_kvs_config fStackY_e90;
  timeval tStackY_e78;
  char *pcStackY_e68;
  char *pcStackY_e60;
  fdb_kvs_handle *pfStackY_e58;
  char *pcStackY_e50;
  char *pcStackY_e48;
  code *pcStackY_e40;
  fdb_file_handle *pfStackY_e30;
  int iStackY_e24;
  fdb_kvs_handle *pfStackY_e20;
  fdb_kvs_handle *pfStackY_e18;
  fdb_kvs_handle *pfStackY_e10;
  fdb_kvs_handle *pfStackY_e08;
  fdb_kvs_handle *pfStackY_e00;
  undefined8 uStackY_df8;
  undefined8 uStackY_df0;
  undefined8 uStackY_de8;
  timeval tStackY_dd8;
  fdb_kvs_config fStackY_dc8;
  fdb_config fStackY_db0;
  char acStackY_cb8 [256];
  char acStackY_bb8 [272];
  char *pcStackY_aa8;
  fdb_kvs_handle *pfStackY_aa0;
  char *pcStackY_a90;
  code *pcStackY_a88;
  fdb_snapshot_info_t *pfStackY_a78;
  fdb_kvs_handle *pfStackY_a70;
  uint64_t uStackY_a68;
  timeval tStackY_a60;
  size_t sStackY_a50;
  fdb_kvs_handle **ppfStackY_a48;
  code *pcStackY_a40;
  fdb_kvs_handle *pfStackY_a38;
  fdb_kvs_handle *pfStackY_a30;
  fdb_kvs_handle *pfStackY_a28;
  fdb_kvs_handle *pfStackY_a20;
  undefined8 uStackY_a18;
  undefined8 uStackY_a10;
  fdb_kvs_handle *pfStackY_a08;
  timeval tStackY_9f8;
  fdb_kvs_config fStackY_9e8;
  fdb_config fStackY_9d0;
  char acStackY_8d8 [256];
  fdb_kvs_handle *apfStackY_7d8 [33];
  fdb_kvs_handle *pfStackY_6d0;
  fdb_kvs_handle *pfStackY_6c8;
  btree *pbStackY_6c0;
  char *pcStackY_6b8;
  fdb_kvs_handle *pfStackY_6b0;
  fdb_kvs_handle *pfStackY_6a8;
  fdb_iterator *pfStack_690;
  uint uStack_684;
  fdb_kvs_handle *pfStack_680;
  fdb_file_handle *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  char *pcStack_668;
  int iStack_660;
  undefined4 uStack_65c;
  fdb_snapshot_info_t *pfStack_658;
  fdb_kvs_handle *pfStack_650;
  fdb_kvs_handle *pfStack_648;
  long lStack_640;
  fdb_kvs_config fStack_638;
  char acStack_620 [256];
  timeval tStack_520;
  undefined1 auStack_510 [48];
  fdb_kvs_handle fStack_4e0;
  fdb_kvs_handle *local_2b0;
  fdb_kvs_handle *local_2a8;
  fdb_file_handle *local_2a0;
  fdb_doc *local_298;
  fdb_iterator *local_290;
  fdb_snapshot_info_t *local_288;
  uint64_t local_280;
  fdb_kvs_info local_278;
  timeval local_248;
  fdb_kvs_config local_238;
  fdb_config local_220;
  char local_128 [256];
  
  gettimeofday(&local_248,(__timezone_ptr_t)0x0);
  memleak_start();
  local_298 = (fdb_doc *)0x0;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_220.wal_threshold = 0x400;
  local_220.flags = 1;
  local_220.block_reusing_threshold = 0;
  fdb_open(&local_2a0,"./compact_test1",&local_220);
  fdb_kvs_open_default(local_2a0,&local_2a8,&local_238);
  pcVar6 = "key%d";
  pcVar11 = (char *)0x0;
  do {
    sprintf(local_128,"key%d",pcVar11);
    pfVar5 = local_2a8;
    sVar3 = strlen(local_128);
    pfVar7 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,local_128,sVar3,"value",5);
    uVar9 = (uint)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compact_upto_post_snapshot_test();
      goto LAB_001129a8;
    }
    fdb_commit(local_2a0,'\x01');
    uVar9 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfVar7 = local_2a8;
  fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129b7;
  pcVar6 = (char *)&local_278.last_seqnum;
  if (local_278.last_seqnum != 10) {
    compact_upto_post_snapshot_test();
  }
  pfVar7 = local_2a8;
  fVar1 = fdb_snapshot_open(local_2a8,&local_2b0,5);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129bc;
  pfVar7 = local_2b0;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c1;
  if (local_278.last_seqnum != 5) {
    compact_upto_post_snapshot_test();
  }
  pfVar13 = local_2a0;
  fVar1 = fdb_get_all_snap_markers(local_2a0,&local_288,&local_280);
  uVar9 = (uint)pfVar13;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c6;
  pfVar13 = local_2a0;
  fVar1 = fdb_compact_upto(local_2a0,(char *)0x0,local_288[5].marker);
  uVar9 = (uint)pfVar13;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129cb;
  fVar1 = fdb_free_snap_markers(local_288,local_280);
  uVar9 = (uint)local_288;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d0;
  pfVar7 = local_2a8;
  fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d5;
  if (local_278.last_seqnum != 10) {
    compact_upto_post_snapshot_test();
  }
  pfVar7 = local_2b0;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129da;
  if (local_278.last_seqnum != 5) {
    compact_upto_post_snapshot_test();
  }
  pfVar7 = local_2b0;
  fVar1 = fdb_iterator_init(local_2b0,&local_290,(void *)0x0,0,(void *)0x0,0,0);
  uVar9 = (uint)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129df;
  pcVar11 = (char *)0x5;
  do {
    pfVar14 = local_290;
    fVar1 = fdb_iterator_get(local_290,&local_298);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129a8;
    fdb_doc_free(local_298);
    local_298 = (fdb_doc *)0x0;
    pfVar7 = local_2a8;
    fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
    uVar9 = (uint)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129ad;
    if (local_278.last_seqnum != 10) {
      compact_upto_post_snapshot_test();
    }
    pfVar7 = local_2b0;
    fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
    uVar9 = (uint)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129b2;
    if (local_278.last_seqnum != 5) {
      compact_upto_post_snapshot_test();
    }
    pfVar14 = local_290;
    fVar1 = fdb_iterator_next(local_290);
    uVar9 = (uint)pfVar14;
    uVar10 = (int)pcVar11 - 1;
    pcVar11 = (char *)(ulong)uVar10;
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  if (uVar10 == 0) {
    fdb_iterator_close(local_290);
    fdb_kvs_close(local_2b0);
    fdb_close(local_2a0);
    fdb_shutdown();
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar6,"compact upto post snapshot test");
    return;
  }
  goto LAB_001129e4;
LAB_0011305f:
  pfStackY_6a8 = (fdb_kvs_handle *)0x113064;
  compact_upto_overwrite_test();
LAB_00113064:
  pfStackY_6a8 = (fdb_kvs_handle *)0x113069;
  compact_upto_overwrite_test();
LAB_00113069:
  pfVar5 = (fdb_kvs_handle *)(auStack_510 + 0x30);
  pfStackY_6a8 = (fdb_kvs_handle *)0x11306e;
  compact_upto_overwrite_test();
LAB_0011306e:
  pfStackY_6a8 = (fdb_kvs_handle *)0x11307e;
  compact_upto_overwrite_test();
LAB_0011307e:
  pfStackY_6a8 = (fdb_kvs_handle *)0x113089;
  compact_upto_overwrite_test();
LAB_00113089:
  pfStackY_6a8 = (fdb_kvs_handle *)0x11308e;
  compact_upto_overwrite_test();
LAB_0011308e:
  pfStackY_6a8 = (fdb_kvs_handle *)0x113093;
  compact_upto_overwrite_test();
LAB_00113093:
  pfStackY_6a8 = (fdb_kvs_handle *)0x113098;
  compact_upto_overwrite_test();
LAB_00113098:
  pfStackY_6a8 = (fdb_kvs_handle *)0x11309d;
  compact_upto_overwrite_test();
LAB_0011309d:
  pfStackY_6a8 = (fdb_kvs_handle *)0x1130a2;
  compact_upto_overwrite_test();
LAB_001130a2:
  pfStackY_6a8 = (fdb_kvs_handle *)0x1130a7;
  compact_upto_overwrite_test();
  goto LAB_001130a7;
LAB_001129a8:
  compact_upto_post_snapshot_test();
LAB_001129ad:
  compact_upto_post_snapshot_test();
LAB_001129b2:
  compact_upto_post_snapshot_test();
LAB_001129b7:
  compact_upto_post_snapshot_test();
LAB_001129bc:
  compact_upto_post_snapshot_test();
LAB_001129c1:
  compact_upto_post_snapshot_test();
LAB_001129c6:
  compact_upto_post_snapshot_test();
LAB_001129cb:
  compact_upto_post_snapshot_test();
LAB_001129d0:
  compact_upto_post_snapshot_test();
LAB_001129d5:
  compact_upto_post_snapshot_test();
LAB_001129da:
  compact_upto_post_snapshot_test();
LAB_001129df:
  compact_upto_post_snapshot_test();
LAB_001129e4:
  compact_upto_post_snapshot_test();
  fStack_4e0.bub_ctx.handle = pfVar5;
  doc = (fdb_kvs_handle *)0x0;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a10;
  uStack_684 = uVar9;
  fStack_4e0.bub_ctx.space_used = (uint64_t)pcVar6;
  gettimeofday(&tStack_520,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_620,"rm -rf  compact_test* > errorlog.txt",0x25);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a40;
  system(acStack_620);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a45;
  memleak_start();
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a4f;
  pcVar6 = (char *)malloc(0x20);
  pfVar7 = (fdb_kvs_handle *)(auStack_510 + 0x130);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a62;
  fdb_get_default_config();
  fStack_4e0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_4e0.config.encryption_key.bytes[0x1d] = '\x02';
  fStack_4e0.config.encryption_key.bytes[0x14] = 1;
  fStack_4e0.config.num_keeping_headers._0_1_ = 1;
  fStack_4e0.config.encryption_key.bytes[4] = '\0';
  fStack_4e0.config.encryption_key.bytes[5] = '\0';
  fStack_4e0.config.encryption_key.bytes[6] = '\0';
  fStack_4e0.config.encryption_key.bytes[7] = '\0';
  fStack_4e0.config.encryption_key.bytes[8] = '\0';
  fStack_4e0.config.encryption_key.bytes[9] = '\0';
  fStack_4e0.config.encryption_key.bytes[10] = '\0';
  fStack_4e0.config.encryption_key.bytes[0xb] = '\0';
  fStack_4e0.max_seqnum = 0;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a85;
  fdb_get_default_kvs_config();
  pfStackY_6a8 = (fdb_kvs_handle *)0x112a99;
  fVar1 = fdb_open(&pfStack_678,"./compact_test",(fdb_config *)pfVar7);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001130a7:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130ac;
    compact_upto_overwrite_test();
LAB_001130ac:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130b1;
    compact_upto_overwrite_test();
LAB_001130b1:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130b6;
    compact_upto_overwrite_test();
LAB_001130b6:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130bb;
    compact_upto_overwrite_test();
LAB_001130bb:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130c0;
    compact_upto_overwrite_test();
LAB_001130c0:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130c5;
    compact_upto_overwrite_test();
LAB_001130c5:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130ca;
    compact_upto_overwrite_test();
LAB_001130ca:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130cf;
    compact_upto_overwrite_test();
LAB_001130cf:
    pfStackY_6a8 = (fdb_kvs_handle *)0x1130d4;
    compact_upto_overwrite_test();
LAB_001130d4:
    pfStackY_6a8 = (fdb_kvs_handle *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_a40 = (code *)0x1130f6;
    pfStackY_6d0 = pfVar7;
    pfStackY_6c8 = pfVar5;
    pbStackY_6c0 = unaff_R13;
    pcStackY_6b8 = pcVar6;
    pfStackY_6b0 = doc;
    pfStackY_6a8 = (fdb_kvs_handle *)pcVar11;
    gettimeofday(&tStackY_9f8,(__timezone_ptr_t)0x0);
    pcStackY_a40 = (code *)0x1130fb;
    memleak_start();
    pcStackY_a40 = (code *)0x113108;
    fdb_get_default_config();
    pcStackY_a40 = (code *)0x113115;
    fdb_get_default_kvs_config();
    fStackY_9d0.compaction_cb_ctx = &uStackY_a18;
    uStackY_a18 = 0;
    uStackY_a10 = 0;
    pfStackY_a08 = (fdb_kvs_handle *)0x0;
    fStackY_9d0.wal_threshold = 0x400;
    fStackY_9d0.flags = 1;
    fStackY_9d0.compaction_cb = compaction_cb_get;
    fStackY_9d0.compaction_cb_mask = 0x1b;
    pcStackY_a40 = (code *)0x11315b;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_a40 = (code *)0x113170;
    fdb_open((fdb_file_handle **)&pfStackY_a38,"./compact_test1",&fStackY_9d0);
    pcStackY_a40 = (code *)0x11318a;
    fdb_kvs_open((fdb_file_handle *)pfStackY_a38,&pfStackY_a20,"db",&fStackY_9e8);
    pcStackY_a40 = (code *)0x11319d;
    fdb_kvs_open((fdb_file_handle *)pfStackY_a38,&pfStackY_a30,"db",&fStackY_9e8);
    uVar12 = 0;
    do {
      pcStackY_a40 = (code *)0x1131c9;
      sprintf((char *)apfStackY_7d8,"key%04d",uVar12);
      pcStackY_a40 = (code *)0x1131d8;
      sprintf(acStackY_8d8,"body%04d",uVar12);
      pfVar5 = pfStackY_a20;
      pcStackY_a40 = (code *)0x1131e5;
      sVar3 = strlen((char *)apfStackY_7d8);
      pcStackY_a40 = (code *)0x1131f0;
      sVar4 = strlen(acStackY_8d8);
      pcStackY_a40 = (code *)0x113204;
      ptr_handle = apfStackY_7d8;
      pfVar7 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_7d8,sVar3,acStackY_8d8,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_a40 = (code *)0x1132c9;
        compact_with_snapshot_open_test();
        goto LAB_001132c9;
      }
      uVar9 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar9;
    } while (uVar9 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_a40 = (code *)0x113224;
    pfVar7 = pfStackY_a38;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_a38,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_a08 = pfStackY_a30;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_a40 = (code *)0x113241;
      pfVar7 = pfStackY_a38;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_a38,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
      ptr_handle = &pfStackY_a28;
      pcStackY_a40 = (code *)0x11325d;
      pfVar7 = pfStackY_a30;
      fVar1 = fdb_snapshot_open(pfStackY_a30,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
      pcStackY_a40 = (code *)0x11326b;
      fdb_kvs_close(pfStackY_a28);
      pcStackY_a40 = (code *)0x113274;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_a38);
      pfVar7 = pfStackY_a38;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
      pcStackY_a40 = (code *)0x11327d;
      fVar1 = fdb_shutdown();
      pfVar7 = pfStackY_a38;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar6 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pcStackY_a40 = (code *)0x1132b2;
        fprintf(_stderr,pcVar6,"compact with snapshot_open test");
        return;
      }
    }
    else {
LAB_001132c9:
      pcStackY_a40 = (code *)0x1132ce;
      compact_with_snapshot_open_test();
LAB_001132ce:
      pcStackY_a40 = (code *)0x1132d3;
      compact_with_snapshot_open_test();
LAB_001132d3:
      pcStackY_a40 = (code *)0x1132d8;
      compact_with_snapshot_open_test();
LAB_001132d8:
      pcStackY_a40 = (code *)0x1132dd;
      compact_with_snapshot_open_test();
    }
    pcStackY_a40 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_a88 = (code *)0x1132fe;
    sStackY_a50 = sVar3;
    ppfStackY_a48 = apfStackY_7d8;
    pcStackY_a40 = (code *)uVar12;
    gettimeofday(&tStackY_a60,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_a88 = (code *)0x11330d;
        compaction_cb_get();
        goto LAB_0011330d;
      }
    }
    else {
LAB_0011330d:
      if (extraout_RDX != 0) goto LAB_00113374;
    }
    pcStackY_a88 = (code *)0x113324;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar7,&pfStackY_a78,&uStackY_a68);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_a88 = (code *)0x113348;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_a30->kvs_config).custom_cmp_param,
                                &pfStackY_a70,pfStackY_a78->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011336a;
      pcStackY_a88 = (code *)0x113356;
      fVar1 = fdb_kvs_close(pfStackY_a70);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return;
      }
    }
    else {
      pcStackY_a88 = (code *)0x11336a;
      compaction_cb_get();
LAB_0011336a:
      pcStackY_a88 = (code *)0x11336f;
      compaction_cb_get();
    }
    pcStackY_a88 = (code *)0x113374;
    compaction_cb_get();
LAB_00113374:
    pcStackY_a88 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_a90 = "body%04d";
    pfStackY_aa0 = pfVar5;
    pcStackY_e40 = (code *)0x113396;
    pcStackY_aa8 = acStackY_8d8;
    pcStackY_a88 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_dd8,(__timezone_ptr_t)0x0);
    pcStackY_e40 = (code *)0x11339b;
    memleak_start();
    pcStackY_e40 = (code *)0x1133ab;
    fdb_get_default_config();
    pcStackY_e40 = (code *)0x1133b8;
    fdb_get_default_kvs_config();
    fStackY_db0.compaction_cb_ctx = &uStackY_df8;
    uStackY_df8 = 0;
    uStackY_df0 = 0;
    uStackY_de8 = 0;
    fStackY_db0.wal_threshold = 0x400;
    fStackY_db0.flags = 1;
    fStackY_db0.compaction_cb = compaction_cb_markers;
    fStackY_db0.compaction_cb_mask = 0x1b;
    pcStackY_e40 = (code *)0x1133fe;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_e40 = (code *)0x113415;
    fdb_open(&pfStackY_e30,"./compact_test1",&fStackY_db0);
    pcStackY_e40 = (code *)0x11342c;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e00,"db1",&fStackY_dc8);
    pcStackY_e40 = (code *)0x113443;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e08,"db2",&fStackY_dc8);
    pcStackY_e40 = (code *)0x11345a;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e10,"db3",&fStackY_dc8);
    pcStackY_e40 = (code *)0x113471;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e18,"db4",&fStackY_dc8);
    pcStackY_e40 = (code *)0x113488;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e20,"db5",&fStackY_dc8);
    uVar12 = 0;
    do {
      iVar2 = (int)uVar12;
      if (iVar2 == 5) goto LAB_0011360c;
      uVar12 = 0;
      iStackY_e24 = iVar2;
      do {
        pcStackY_e40 = (code *)0x1134c6;
        sprintf(acStackY_bb8,"key%04d",uVar12);
        pcStackY_e40 = (code *)0x1134d5;
        sprintf(acStackY_cb8,"body%04d",uVar12);
        pfVar5 = pfStackY_e00;
        pcStackY_e40 = (code *)0x1134e2;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x1134f0;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113504;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e08;
        pcStackY_e40 = (code *)0x113511;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x11351c;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113530;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e10;
        pcStackY_e40 = (code *)0x11353d;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x113548;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x11355c;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e18;
        pcStackY_e40 = (code *)0x113569;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x113574;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113588;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar7 = pfStackY_e20;
        pcStackY_e40 = (code *)0x113595;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x1135a0;
        sVar3 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x1135be;
        fdb_set_kv(pfVar7,acStackY_bb8,(size_t)pfVar5,acStackY_cb8,sVar3);
        uVar9 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar9;
      } while (uVar9 != 1000);
      pcStackY_e40 = (code *)0x1135db;
      pfVar13 = pfStackY_e30;
      fVar1 = fdb_commit(pfStackY_e30,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_e40 = (code *)0x11366b;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_0011366b;
      }
      uVar12 = (ulong)(iStackY_e24 + 1U);
      uStackY_df8 = CONCAT44(uStackY_df8._4_4_,(iStackY_e24 + 1U) * 1000);
      pcStackY_e40 = (code *)0x1135ff;
      fVar1 = fdb_compact(pfStackY_e30,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_e40 = (code *)0x11360c;
    compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
    pcStackY_e40 = (code *)0x113616;
    pfVar13 = pfStackY_e30;
    fVar1 = fdb_close(pfStackY_e30);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_e40 = (code *)0x11361f;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar6 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pcStackY_e40 = (code *)0x113654;
        fprintf(_stderr,pcVar6,"compact with snapshot_open multi kvs test");
        return;
      }
    }
    else {
LAB_0011366b:
      pcStackY_e40 = (code *)0x113670;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_e40 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_e48 = "body%04d";
    pcStackY_e68 = "key%04d";
    pcStackY_eb8 = (code *)0x11369a;
    pcStackY_e60 = acStackY_cb8;
    pfStackY_e58 = pfVar5;
    pcStackY_e50 = acStackY_bb8;
    pcStackY_e40 = (code *)uVar12;
    gettimeofday(&tStackY_e78,(__timezone_ptr_t)0x0);
    pcStackY_eb8 = (code *)0x1136a4;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_e30->root;
    pcStackY_eb8 = (code *)0x1136b7;
    fVar1 = fdb_get_all_snap_markers(pfVar13,&pfStackY_eb0,&uStackY_ea8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (pfStackY_eb0->num_kvs_markers != 6) {
        pcStackY_eb8 = (code *)0x113799;
        compaction_cb_markers();
      }
      seqnum = pfStackY_eb0->kvs_markers->seqnum;
      if (seqnum == (long)iVar2) {
        if (uStackY_ea8 != 0) {
          uVar12 = 0;
          do {
            if (pfStackY_eb0[uVar12].num_kvs_markers != 0) {
              lVar15 = 0;
              uVar16 = 0;
              do {
                pcVar6 = *(char **)((long)&(pfStackY_eb0[uVar12].kvs_markers)->kv_store_name +
                                   lVar15);
                if (pcVar6 != (char *)0x0) {
                  pcStackY_eb8 = (code *)0x11372e;
                  fdb_kvs_open(pfVar13,&pfStackY_ea0,pcVar6,&fStackY_e90);
                  pcStackY_eb8 = (code *)0x113740;
                  fVar1 = fdb_snapshot_open(pfStackY_ea0,&pfStackY_e98,seqnum);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_eb8 = (code *)0x11374e;
                    fVar1 = fdb_kvs_close(pfStackY_e98);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_eb8 = (code *)0x1137a3;
                      compaction_cb_markers();
                      goto LAB_001137a3;
                    }
                    pcStackY_eb8 = (code *)0x11375c;
                    fVar1 = fdb_kvs_close(pfStackY_ea0);
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                  }
                  else {
LAB_001137a3:
                    pcStackY_eb8 = (code *)0x1137a8;
                    compaction_cb_markers();
                  }
                  pcStackY_eb8 = (code *)0x1137ad;
                  compaction_cb_markers();
                  goto LAB_001137ad;
                }
LAB_00113760:
                uVar16 = uVar16 + 1;
                lVar15 = lVar15 + 0x10;
              } while (uVar16 < (ulong)pfStackY_eb0[uVar12].num_kvs_markers);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uStackY_ea8);
        }
        return;
      }
    }
    else {
LAB_001137ad:
      pcStackY_eb8 = (code *)0x1137b2;
      compaction_cb_markers();
    }
    pcStackY_eb8 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_fc0,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_fb0.compaction_cb = cb_cancel_test;
    fStackY_fb0.compaction_cb_ctx = (void *)0x0;
    fStackY_fb0.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_fc8,"compact_test",&fStackY_fb0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_fc8,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_fc8);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pfStackY_6a8 = (fdb_kvs_handle *)0x112abc;
  fVar1 = fdb_kvs_open(pfStack_678,&pfStack_670,"db",&fStack_638);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ac;
  pcVar11 = (char *)CONCAT71((int7)((ulong)pcVar11 >> 8),uStack_684 == 0);
  pcStack_668 = pcVar6 + 0x1a;
  pfVar5 = (fdb_kvs_handle *)(auStack_510 + 0x30);
  unaff_R13 = (btree *)auStack_510;
  doc = (fdb_kvs_handle *)0x0;
  do {
    uVar10 = (uint)doc;
    uVar9 = uVar10 + (int)((ulong)doc / 5) * -5;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112b17;
    sprintf((char *)pfVar5,"key%06d",(ulong)uVar9);
    builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_668,"<end>",6);
    __format = "updated_value%08d";
    if (uVar10 < 5) {
      __format = "value%08d";
    }
    pfStackY_6a8 = (fdb_kvs_handle *)0x112b5a;
    sprintf(pcVar6,__format,(ulong)uVar9);
    pfVar7 = pfStack_670;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112b67;
    sVar3 = strlen((char *)pfVar5);
    pfStackY_6a8 = (fdb_kvs_handle *)0x112b7f;
    fVar1 = fdb_set_kv(pfVar7,pfVar5,sVar3 + 1,pcVar6,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar8 = doc;
    if (uStack_684 == 3) {
LAB_00112ba0:
      pcVar11 = (char *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (uStack_684 == 2) {
      pfVar8 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)doc >> 8),~(byte)doc);
      goto LAB_00112ba0;
    }
    pfStackY_6a8 = (fdb_kvs_handle *)0x112bb2;
    fVar1 = fdb_commit(pfStack_678,(fdb_commit_opt_t)pcVar11);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113064;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112bc7;
    fVar1 = fdb_get_kvs_info(pfStack_670,(fdb_kvs_info *)unaff_R13);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    doc = (fdb_kvs_handle *)(ulong)(uVar10 + 1);
  } while (uVar10 + 1 != 10);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112bf0;
  fVar1 = fdb_get_all_snap_markers(pfStack_678,&pfStack_658,(uint64_t *)&iStack_660);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b1;
  pfVar7 = (fdb_kvs_handle *)(CONCAT44(uStack_65c,iStack_660) >> 1);
  iVar2 = (int)pfVar7;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112c21;
  fVar1 = fdb_compact_upto(pfStack_678,"./compact_test2",pfStack_658[iVar2].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b6;
  if (-1 < (int)(iStack_660 - 1U)) {
    pfVar7 = (fdb_kvs_handle *)(ulong)(iStack_660 - 1U);
    lStack_640 = (long)iVar2;
    pfVar5 = (fdb_kvs_handle *)(auStack_510 + 0x30);
    do {
      doc = (fdb_kvs_handle *)(pfStack_658[(long)pfVar7].kvs_markers)->seqnum;
      pfStackY_6a8 = (fdb_kvs_handle *)0x112c6e;
      fVar1 = fdb_snapshot_open(pfStack_670,&pfStack_650,(fdb_seqnum_t)doc);
      if (lStack_640 < (long)pfVar7) {
        pfVar8 = pfVar7;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113089;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011308e;
        pfStackY_6a8 = (fdb_kvs_handle *)0x112caf;
        pfStack_648 = pfVar7;
        fVar1 = fdb_iterator_init(pfStack_650,&pfStack_690,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113093;
        doc = (fdb_kvs_handle *)((long)&doc[-1].bub_ctx.handle + 3);
        pfVar7 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_680 = (fdb_kvs_handle *)0x0;
          pfStackY_6a8 = (fdb_kvs_handle *)0x112cd5;
          fVar1 = fdb_iterator_get(pfStack_690,(fdb_doc **)&pfStack_680);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfStackY_6a8 = (fdb_kvs_handle *)0x112cf0;
          sprintf((char *)pfVar5,"key%06d",(ulong)pfVar7 & 0xffffffff);
          builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
          builtin_strncpy(pcStack_668,"<end>",6);
          pcVar11 = "value%08d";
          if (pfVar7 < doc) {
            pcVar11 = "updated_value%08d";
          }
          pfStackY_6a8 = (fdb_kvs_handle *)0x112d32;
          sprintf(pcVar6,pcVar11,(ulong)pfVar7 & 0xffffffff);
          pcVar11 = (char *)pfStack_680;
          unaff_R13 = (btree *)pfStack_680->op_stats;
          pfStackY_6a8 = (fdb_kvs_handle *)0x112d4a;
          iVar2 = bcmp(unaff_R13,pfVar5,*(size_t *)&pfStack_680->kvs_config);
          if (iVar2 != 0) {
            pfStackY_6a8 = (fdb_kvs_handle *)0x113054;
            compact_upto_overwrite_test();
LAB_00113054:
            pfStackY_6a8 = (fdb_kvs_handle *)0x11305f;
            compact_upto_overwrite_test();
            goto LAB_0011305f;
          }
          unaff_R13 = (((fdb_kvs_handle *)pcVar11)->field_6).seqtree;
          pfStackY_6a8 = (fdb_kvs_handle *)0x112d65;
          iVar2 = bcmp(unaff_R13,pcVar6,
                       (size_t)(((fdb_kvs_handle *)pcVar11)->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113054;
          pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
          pfStackY_6a8 = (fdb_kvs_handle *)0x112d78;
          fdb_doc_free((fdb_doc *)pcVar11);
          pfStackY_6a8 = (fdb_kvs_handle *)0x112d82;
          fVar1 = fdb_iterator_next(pfStack_690);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pfStackY_6a8 = (fdb_kvs_handle *)0x112d94;
        fVar1 = fdb_iterator_close(pfStack_690);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113098;
        if ((int)pfVar7 != 5) goto LAB_001130a2;
        pfStackY_6a8 = (fdb_kvs_handle *)0x112daf;
        fVar1 = fdb_kvs_close(pfStack_650);
        pfVar7 = pfStack_648;
        pfVar8 = pfStack_648;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011309d;
      }
      pfVar7 = (fdb_kvs_handle *)((long)&pfVar8[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar8);
  }
  pfVar5 = (fdb_kvs_handle *)(auStack_510 + 0x30);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112dec;
  fVar1 = fdb_iterator_init(pfStack_670,&pfStack_690,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130bb;
  unaff_R13 = (btree *)(auStack_510 + 0x30);
  pcVar11 = "updated_value%08d";
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_680 = (fdb_kvs_handle *)0x0;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112e1d;
    fVar1 = fdb_iterator_get(pfStack_690,(fdb_doc **)&pfStack_680);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112e38;
    sprintf((char *)unaff_R13,"key%06d",pfVar7);
    builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_668,"<end>",6);
    pfStackY_6a8 = (fdb_kvs_handle *)0x112e68;
    sprintf(pcVar6,"updated_value%08d",pfVar7);
    doc = pfStack_680;
    pfVar5 = (fdb_kvs_handle *)pfStack_680->op_stats;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112e7f;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_680->kvs_config);
    if (iVar2 != 0) goto LAB_0011306e;
    pfVar5 = (fdb_kvs_handle *)(doc->field_6).seqtree;
    pfStackY_6a8 = (fdb_kvs_handle *)0x112e9a;
    iVar2 = bcmp(pfVar5,pcVar6,(size_t)(doc->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_0011307e;
    pfVar7 = (fdb_kvs_handle *)(ulong)((int)pfVar7 + 1);
    pfStackY_6a8 = (fdb_kvs_handle *)0x112eac;
    fdb_doc_free((fdb_doc *)doc);
    pfStackY_6a8 = (fdb_kvs_handle *)0x112eb6;
    fVar1 = fdb_iterator_next(pfStack_690);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112ec8;
  fVar1 = fdb_iterator_close(pfStack_690);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130c0;
  if ((int)pfVar7 != 5) goto LAB_001130c5;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112ee8;
  fVar1 = fdb_free_snap_markers(pfStack_658,CONCAT44(uStack_65c,iStack_660));
  uVar9 = uStack_684;
  pfVar7 = (fdb_kvs_handle *)(ulong)uStack_684;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ca;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112efc;
  free(pcVar6);
  pfStackY_6a8 = (fdb_kvs_handle *)0x112f06;
  fVar1 = fdb_close(pfStack_678);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130cf;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112f13;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130d4;
  pfStackY_6a8 = (fdb_kvs_handle *)0x112f20;
  memleak_end();
  builtin_strncpy(acStack_620 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_620,"compact upto ove",0x10);
  switch(uVar9) {
  case 0:
    pfStackY_6a8 = (fdb_kvs_handle *)0x112f66;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pfStackY_6a8 = (fdb_kvs_handle *)0x112fea;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3," (WAL)",7);
    break;
  case 2:
    pfStackY_6a8 = (fdb_kvs_handle *)0x112f92;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3 + 0xe,"ie/WAL)",8);
    uVar17._0_1_ = ' ';
    uVar17._1_1_ = 'H';
    uVar17._2_1_ = 'B';
    uVar17._3_1_ = '+';
    uVar18._0_1_ = 't';
    uVar18._1_1_ = 'r';
    uVar18._2_1_ = 'i';
    uVar18._3_1_ = 'e';
    goto LAB_00112fd3;
  case 3:
    pfStackY_6a8 = (fdb_kvs_handle *)0x112fba;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3 + 0xe,"B+trie)",8);
    uVar17._0_1_ = ' ';
    uVar17._1_1_ = 'W';
    uVar17._2_1_ = 'A';
    uVar17._3_1_ = 'L';
    uVar18._0_1_ = '/';
    uVar18._1_1_ = 'H';
    uVar18._2_1_ = 'B';
    uVar18._3_1_ = '+';
LAB_00112fd3:
    pcVar6 = acStack_620 + sVar3;
    pcVar6[0] = ' ';
    pcVar6[1] = '(';
    pcVar6[2] = 'm';
    pcVar6[3] = 'i';
    pcVar6 = acStack_620 + sVar3 + 4;
    pcVar6[0] = 'x';
    pcVar6[1] = 'e';
    pcVar6[2] = 'd';
    pcVar6[3] = ',';
    *(undefined4 *)(acStack_620 + sVar3 + 8) = uVar17;
    *(undefined4 *)(acStack_620 + sVar3 + 0xc) = uVar18;
  }
  pcVar6 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar6 = "%s FAILED\n";
  }
  pfStackY_6a8 = (fdb_kvs_handle *)0x113032;
  fprintf(_stderr,pcVar6,acStack_620);
  return;
}

Assistant:

void compact_upto_post_snapshot_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    fdb_kvs_info kvs_info;
    uint64_t num_markers;
    char keybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    // prevent block reusing to keep snapshots
    fconfig.block_reusing_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // check  db info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);

    // open snapshot at seqnum 5
    status = fdb_snapshot_open(db, &snap_db, 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snap info
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // compact upto
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact_upto(dbfile, NULL, markers[5].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check db and snap info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // iterate over snapshot
    status = fdb_iterator_init(snap_db,
                               &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;

        // check db and snap info
        status = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 10);
        status = fdb_get_kvs_info(snap_db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 5);
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(i == 5);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto post snapshot test");
}